

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

SatType __thiscall features::Surf::filter_dyy(Surf *this,int fs,int x,int y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int index;
  int index_00;
  int index_01;
  ImageBase *this_00;
  element_type *peVar9;
  long *plVar10;
  SatType ret;
  SatType v7;
  SatType v6;
  SatType v5;
  SatType v4;
  SatType v3;
  SatType v2;
  SatType v1;
  SatType v0;
  int row4;
  int row3;
  int row2;
  int row1;
  int fs2;
  int w;
  int y_local;
  int x_local;
  int fs_local;
  Surf *this_local;
  
  this_00 = (ImageBase *)
            std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  iVar8 = core::ImageBase::width(this_00);
  index = (x - fs) + iVar8 * (((y - fs) - fs / 2) + -1);
  index_00 = index + iVar8 * fs;
  index_01 = index_00 + iVar8 * fs;
  iVar8 = index_01 + iVar8 * fs;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index);
  lVar1 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index_00);
  lVar2 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index_01);
  lVar3 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,iVar8);
  lVar4 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index + fs * 2 + -1);
  lVar5 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index_00 + fs * 2 + -1);
  lVar6 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index_01 + fs * 2 + -1);
  lVar7 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,iVar8 + fs * 2 + -1);
  return (((*plVar10 + lVar3) - lVar4) - lVar7) +
         (((lVar6 + lVar1) - lVar2) - lVar5) + (((lVar7 + lVar2) - lVar3) - lVar6) * -2;
}

Assistant:

Surf::SatType
Surf::filter_dyy (int fs, int x, int y)
{
    int const w = this->sat->width();
    int const fs2 = fs / 2;
    int const row1 = (x - fs) + w * (y - fs - fs2 - 1);
    int const row2 = row1 + w * fs;
    int const row3 = row2 + w * fs;
    int const row4 = row3 + w * fs;

    Surf::SatType const v0 = this->sat->at(row1);
    Surf::SatType const v1 = this->sat->at(row2);
    Surf::SatType const v2 = this->sat->at(row3);
    Surf::SatType const v3 = this->sat->at(row4);
    Surf::SatType const v4 = this->sat->at(row1 + fs + fs - 1);
    Surf::SatType const v5 = this->sat->at(row2 + fs + fs - 1);
    Surf::SatType const v6 = this->sat->at(row3 + fs + fs - 1);
    Surf::SatType const v7 = this->sat->at(row4 + fs + fs - 1);

    Surf::SatType ret = 0;
    ret += v5 + v0 - v1 - v4;
    ret -= 2 * (v6 + v1 - v2 - v5);
    ret += v7 + v2 - v3 - v6;
    return ret;
}